

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_sextract_i32_riscv64
               (TCGContext_conflict11 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg,uint ofs,uint len)

{
  int iVar1;
  TCGOp *pTVar2;
  uintptr_t o;
  uint arg2;
  TCGOpcode TVar3;
  uintptr_t o_1;
  
  iVar1 = len + ofs;
  if (iVar1 == 0x20) {
    arg2 = 0x20 - len;
  }
  else {
    if (ofs == 0) {
      if (len == 8) {
        TVar3 = INDEX_op_ext8s_i32;
LAB_00c61e6e:
        pTVar2 = tcg_emit_op_riscv64(tcg_ctx,TVar3);
        pTVar2->args[0] = (TCGArg)(ret + (long)tcg_ctx);
        pTVar2->args[1] = (TCGArg)(arg + (long)tcg_ctx);
        return;
      }
      if (len == 0x10) {
        TVar3 = INDEX_op_ext16s_i32;
        goto LAB_00c61e6e;
      }
    }
    if (len == 8 && ofs == 8) {
      pTVar2 = tcg_emit_op_riscv64(tcg_ctx,INDEX_op_sextract_i32);
      pTVar2->args[0] = (TCGArg)(ret + (long)tcg_ctx);
      pTVar2->args[1] = (TCGArg)(arg + (long)tcg_ctx);
      pTVar2->args[2] = 8;
      pTVar2->args[3] = 8;
      return;
    }
    if (iVar1 == 8) {
      TVar3 = INDEX_op_ext8s_i32;
    }
    else {
      if (iVar1 != 0x10) {
        if (len == 8) {
          tcg_gen_shri_i32_riscv64(tcg_ctx,ret,arg,ofs);
          TVar3 = INDEX_op_ext8s_i32;
        }
        else {
          if (len != 0x10) {
            arg2 = 0x20 - len;
            tcg_gen_shli_i32_riscv64(tcg_ctx,ret,arg,arg2 - ofs);
            arg = ret;
            goto LAB_00c61dd4;
          }
          tcg_gen_shri_i32_riscv64(tcg_ctx,ret,arg,ofs);
          TVar3 = INDEX_op_ext16s_i32;
        }
        pTVar2 = tcg_emit_op_riscv64(tcg_ctx,TVar3);
        pTVar2->args[0] = (TCGArg)(ret + (long)tcg_ctx);
        pTVar2->args[1] = (TCGArg)(ret + (long)tcg_ctx);
        return;
      }
      TVar3 = INDEX_op_ext16s_i32;
    }
    pTVar2 = tcg_emit_op_riscv64(tcg_ctx,TVar3);
    pTVar2->args[0] = (TCGArg)(ret + (long)&tcg_ctx->pool_cur);
    pTVar2->args[1] = (TCGArg)(arg + (long)tcg_ctx);
    arg = ret;
    arg2 = ofs;
  }
LAB_00c61dd4:
  tcg_gen_sari_i32_riscv64(tcg_ctx,ret,arg,arg2);
  return;
}

Assistant:

void tcg_gen_sextract_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg,
                          unsigned int ofs, unsigned int len)
{
    tcg_debug_assert(ofs < 32);
    tcg_debug_assert(len > 0);
    tcg_debug_assert(len <= 32);
    tcg_debug_assert(ofs + len <= 32);

    /* Canonicalize certain special cases, even if extract is supported.  */
    if (ofs + len == 32) {
        tcg_gen_sari_i32(tcg_ctx, ret, arg, 32 - len);
        return;
    }
    if (ofs == 0) {
        switch (len) {
        case 16:
            tcg_gen_ext16s_i32(tcg_ctx, ret, arg);
            return;
        case 8:
            tcg_gen_ext8s_i32(tcg_ctx, ret, arg);
            return;
        }
    }

    if (TCG_TARGET_HAS_sextract_i32
        && TCG_TARGET_extract_i32_valid(ofs, len)) {
        tcg_gen_op4ii_i32(tcg_ctx, INDEX_op_sextract_i32, ret, arg, ofs, len);
        return;
    }

    /* Assume that sign-extension, if available, is cheaper than a shift.  */
    switch (ofs + len) {
    case 16:
        if (TCG_TARGET_HAS_ext16s_i32) {
            tcg_gen_ext16s_i32(tcg_ctx, ret, arg);
            tcg_gen_sari_i32(tcg_ctx, ret, ret, ofs);
            return;
        }
        break;
    case 8:
        if (TCG_TARGET_HAS_ext8s_i32) {
            tcg_gen_ext8s_i32(tcg_ctx, ret, arg);
            tcg_gen_sari_i32(tcg_ctx, ret, ret, ofs);
            return;
        }
        break;
    }
    switch (len) {
    case 16:
        if (TCG_TARGET_HAS_ext16s_i32) {
            tcg_gen_shri_i32(tcg_ctx, ret, arg, ofs);
            tcg_gen_ext16s_i32(tcg_ctx, ret, ret);
            return;
        }
        break;
    case 8:
        if (TCG_TARGET_HAS_ext8s_i32) {
            tcg_gen_shri_i32(tcg_ctx, ret, arg, ofs);
            tcg_gen_ext8s_i32(tcg_ctx, ret, ret);
            return;
        }
        break;
    }

    tcg_gen_shli_i32(tcg_ctx, ret, arg, 32 - len - ofs);
    tcg_gen_sari_i32(tcg_ctx, ret, ret, 32 - len);
}